

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O0

void process_task(void *p)

{
  uint uVar1;
  RK_U32 RVar2;
  int iVar3;
  Mutex *this;
  long *plVar4;
  MppDevBatCmd *pMVar5;
  long lVar6;
  list_head *plVar7;
  undefined8 uVar8;
  uint uVar9;
  MppDevBatCmd *pMVar10;
  int *piVar11;
  MppReqV1 *pMVar12;
  undefined8 *puVar13;
  __sighandler_t __handler;
  char *req_00;
  char *in_stack_fffffffffffffee0;
  list_head *local_108;
  MppDevBatTask *local_100;
  MppDevBatTask *local_f8;
  MppDevBatTask *local_e0;
  int local_d4;
  RK_S32 i;
  list_head *pos___3;
  list_head *head___3;
  list_head *pos___2;
  list_head *head___2;
  list_head *pos___1;
  list_head *head___1;
  MppDevBatCmd *cmd;
  MppDevBatTask *pMStack_78;
  RK_S32 batch_slot_id;
  MppDevTask *n;
  list_head *pos__;
  list_head *head__;
  RK_S32 pending;
  MppReqV1 *req;
  MppDevBatCmd *bat_cmd;
  MppDevSession *session;
  MppDevBatTask *batch;
  MppDevTask *task;
  RK_S32 ret;
  Mutex *lock;
  MppDevBatServ *server;
  void *p_local;
  
  this = *p;
  if ((mpp_server_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_server","process task start\n",(char *)0x0);
  }
  while( true ) {
    plVar4 = *(long **)((long)p + 0x38);
    if (plVar4 == (long *)((long)p + 0x38)) {
      local_e0 = (MppDevBatTask *)0x0;
    }
    else {
      local_e0 = (MppDevBatTask *)(plVar4 + -1);
    }
    if (local_e0 == (MppDevBatTask *)0x0) goto LAB_001951b4;
    if ((local_e0->wait_req_cnt == 0) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch->wait_req_cnt"
                   ,"process_task",0x103), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    req_00 = (char *)local_e0->wait_reqs;
    uVar9 = mpp_service_ioctl_request(*(RK_S32 *)((long)p + 8),(MppReqV1 *)req_00);
    if (uVar9 != 0) break;
    plVar7 = (local_e0->link_tasks).next;
    batch = (MppDevBatTask *)(plVar7 + -2);
    plVar7 = plVar7->next;
    while (pMStack_78 = (MppDevBatTask *)(plVar7 + -2),
          (list_head *)&(batch->link_tasks).prev != &local_e0->link_tasks) {
      pMVar10 = local_e0->bat_cmd + batch->send_req_cnt;
      if (*(int *)((long)p + 0x70) <= batch->send_req_cnt) {
        req_00 = "mpp_server";
        _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "batch_slot_id < server->max_task_in_batch","process_task",0x10c);
        if ((mpp_debug & 0x10000000) != 0) {
          abort();
        }
      }
      pMVar5 = batch->bat_cmd;
      iVar3 = pMVar10->ret;
      if (iVar3 != 0xb) {
        if (iVar3 == -5) {
          req_00 = "mpp_server";
          _mpp_log_l(2,"mpp_server","batch %d:%d task %d poll error found\n","process_task",
                     (ulong)local_e0->batch_id,(ulong)(uint)batch->send_req_cnt,
                     *(undefined4 *)((long)&batch->wait_reqs + 4));
          pMVar10->flag = pMVar10->flag | 1;
        }
        else if (iVar3 == 0) {
          list_del_init((list_head *)&(batch->link_tasks).prev);
          batch->send_reqs = (MppReqV1 *)0x0;
          if ((mpp_server_debug & 1) != 0) {
            req_00 = "mpp_server";
            _mpp_log_l(4,"mpp_server","batch %d:%d session %d ready and remove\n",(char *)0x0,
                       (ulong)local_e0->batch_id,(ulong)(uint)batch->send_req_cnt,pMVar5[4].client);
          }
          MppMutexCond::lock((MppMutexCond *)pMVar5->flag);
          *(int *)&pMVar5[5].flag = (int)pMVar5[5].flag + 1;
          MppMutexCond::signal((MppMutexCond *)pMVar5->flag,(int)req_00,__handler);
          MppMutexCond::unlock((MppMutexCond *)pMVar5->flag);
          lVar6._0_4_ = pMVar5[3].client;
          lVar6._4_4_ = pMVar5[3].ret;
          if ((lVar6 != 0) && (*(long *)(*(long *)&pMVar5[3].client + 0x20) != 0)) {
            req_00 = *(char **)(*(long *)&pMVar5[3].client + 0x20);
            mpp_callback_f("process_task",(MppCbCtx *)req_00,(void *)0x0);
          }
          local_e0->poll_cnt = local_e0->poll_cnt + 1;
          pMVar10->flag = pMVar10->flag | 1;
        }
      }
      batch = pMStack_78;
      plVar7 = plVar7->next;
    }
    if ((mpp_server_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_server","batch %d fill %d poll %d\n",(char *)0x0,(ulong)local_e0->batch_id,
                 (ulong)(uint)local_e0->fill_cnt,local_e0->poll_cnt);
    }
    if (local_e0->poll_cnt != local_e0->fill_cnt) goto LAB_001951b4;
    if ((mpp_server_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_server","batch %d poll done\n",(char *)0x0,(ulong)local_e0->batch_id);
    }
    list_del_init(&local_e0->link_server);
    list_add_tail(&local_e0->link_server,(list_head *)((long)p + 0x48));
    *(int *)((long)p + 0x68) = *(int *)((long)p + 0x68) + -1;
    *(int *)((long)p + 0x6c) = *(int *)((long)p + 0x6c) + 1;
    batch_reset(local_e0);
  }
  uVar1 = local_e0->batch_id;
  piVar11 = __errno_location();
  iVar3 = *piVar11;
  piVar11 = __errno_location();
  in_stack_fffffffffffffee0 = strerror(*piVar11);
  _mpp_log_l(4,"mpp_server","batch %d poll ret %d errno %d %s","process_task",(ulong)uVar1,
             (ulong)uVar9,iVar3,in_stack_fffffffffffffee0);
  _mpp_log_l(4,"mpp_server","stop timer\n","process_task");
  mpp_timer_set_enable(*(MppTimer *)((long)p + 0x18),0);
LAB_001951b4:
  Mutex::lock(this);
  head__._4_4_ = *(uint *)((long)p + 0x88);
  if ((((head__._4_4_ == 0) && (*(int *)((long)p + 0x68) == 0)) && (*(int *)((long)p + 0x30) == 0))
     && (mpp_timer_set_enable(*(MppTimer *)((long)p + 0x18),0), (mpp_server_debug & 1) != 0)) {
    _mpp_log_l(4,"mpp_server","stop timer\n",(char *)0x0);
  }
  Mutex::unlock(this);
  if ((mpp_server_debug & 1) != 0) {
    in_stack_fffffffffffffee0 =
         (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                          *(undefined4 *)((long)p + 0x60));
    _mpp_log_l(4,"mpp_server","pending %d running %d free %d max %d process start\n",(char *)0x0,
               (ulong)head__._4_4_,(ulong)*(uint *)((long)p + 0x68),*(undefined4 *)((long)p + 0x6c),
               in_stack_fffffffffffffee0);
  }
  while( true ) {
    if (*(int *)((long)p + 0x6c) == 0) {
      if (*(int *)((long)p + 0x60) <= *(int *)((long)p + 0x6c) + *(int *)((long)p + 0x68)) {
        if ((mpp_server_debug & 1) == 0) {
          return;
        }
        _mpp_log_l(4,"mpp_server","finish for not batch slot\n",(char *)0x0);
        return;
      }
      batch_add((MppDevBatServ *)p);
    }
    if ((*(int *)((long)p + 0x6c) == 0) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"server->batch_free",
                   "process_task",0x159), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (head__._4_4_ == 0) {
      if (*(int *)((long)p + 0x6c) != 0) {
        plVar4 = *(long **)((long)p + 0x48);
        if (plVar4 == (long *)((long)p + 0x48)) {
          local_f8 = (MppDevBatTask *)0x0;
        }
        else {
          local_f8 = (MppDevBatTask *)(plVar4 + -1);
        }
        if ((local_f8 == (MppDevBatTask *)0x0) &&
           (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch",
                       "process_task",0x163), (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        if (local_f8 == (MppDevBatTask *)0x0) {
          _mpp_log_l(4,"mpp_server","batch run %d free %d\n","process_task",
                     (ulong)*(uint *)((long)p + 0x68),(ulong)*(uint *)((long)p + 0x6c));
        }
        else {
          if (local_f8->fill_cnt != 0) {
            batch_send((MppDevBatServ *)p,local_f8);
          }
          if ((mpp_server_debug & 1) != 0) {
            _mpp_log_l(4,"mpp_server","finish for no pending task\n",(char *)0x0);
          }
        }
      }
      return;
    }
    if ((mpp_server_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_server","pending task %d left to process\n",(char *)0x0,(ulong)head__._4_4_)
      ;
    }
    if (*(int *)((long)p + 0x6c) == 0) {
      return;
    }
    plVar4 = *(long **)((long)p + 0x48);
    if (plVar4 == (long *)((long)p + 0x48)) {
      local_100 = (MppDevBatTask *)0x0;
    }
    else {
      local_100 = (MppDevBatTask *)(plVar4 + -1);
    }
    if ((local_100 == (MppDevBatTask *)0x0) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch",
                   "process_task",0x17a), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((head__._4_4_ == 0) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"pending",
                   "process_task",0x17b), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    Mutex::lock(this);
    local_108 = ((list_head *)((long)p + 0x78))->next;
    if (local_108 == (list_head *)((long)p + 0x78)) {
      local_108 = (list_head *)0x0;
    }
    list_del_init(local_108);
    *(int *)((long)p + 0x88) = *(int *)((long)p + 0x88) + -1;
    Mutex::unlock(this);
    head__._4_4_ = head__._4_4_ - 1;
    if (local_100->fill_cnt == 0) {
      RVar2 = *(RK_U32 *)((long)p + 0xc);
      *(RK_U32 *)((long)p + 0xc) = RVar2 + 1;
      local_100->batch_id = RVar2;
    }
    local_108[3].prev = (list_head *)local_100;
    iVar3 = local_100->fill_cnt;
    local_100->fill_cnt = iVar3 + 1;
    *(int *)&local_108[4].prev = iVar3;
    if ((*(int *)((long)p + 0x70) <= *(int *)&local_108[4].prev) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "task->batch_slot_id < server->max_task_in_batch","process_task",0x18b),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    list_add_tail(local_108 + 2,&local_100->link_tasks);
    if (*(int *)((long)p + 0x70) <= local_100->fill_cnt) {
      local_100->fill_full = 1;
    }
    plVar7 = local_108[3].next;
    if ((plVar7 == (list_head *)0x0) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"session",
                   "process_task",0x191), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((plVar7[3].prev == (list_head *)0x0) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"session->ctx",
                   "process_task",0x192), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    pMVar10 = local_100->bat_cmd + *(int *)&local_108[4].prev;
    pMVar10->flag = 0;
    pMVar10->client = *(RK_S32 *)&plVar7[4].prev;
    pMVar10->ret = 0;
    iVar3 = local_100->send_req_cnt;
    local_100->send_req_cnt = iVar3 + 1;
    pMVar12 = local_100->send_reqs + iVar3;
    pMVar12->cmd = 0x204;
    pMVar12->flag = 1;
    pMVar12->offset = 0;
    pMVar12->size = 0x10;
    pMVar12->data_ptr = (RK_U64)pMVar10;
    for (local_d4 = 0; local_d4 < *(int *)&local_108[5].prev; local_d4 = local_d4 + 1) {
      puVar13 = (undefined8 *)((long)local_108[5].next + (long)local_d4 * 0x18);
      iVar3 = local_100->send_req_cnt;
      local_100->send_req_cnt = iVar3 + 1;
      pMVar12 = local_100->send_reqs + iVar3;
      uVar8 = *puVar13;
      pMVar12->cmd = (int)uVar8;
      pMVar12->flag = (int)((ulong)uVar8 >> 0x20);
      uVar8 = puVar13[1];
      pMVar12->size = (int)uVar8;
      pMVar12->offset = (int)((ulong)uVar8 >> 0x20);
      pMVar12->data_ptr = puVar13[2];
    }
    if ((*(int *)((long)p + 0x70) * 0x10 < local_100->send_req_cnt) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "batch->send_req_cnt <= server->max_task_in_batch * 16","process_task",0x1a9),
       (mpp_debug & 0x10000000) != 0)) break;
    iVar3 = local_100->wait_req_cnt;
    local_100->wait_req_cnt = iVar3 + 1;
    pMVar12 = local_100->wait_reqs + iVar3;
    pMVar12->cmd = 0x204;
    pMVar12->flag = 1;
    pMVar12->offset = 0;
    pMVar12->size = 0x10;
    pMVar12->data_ptr = (RK_U64)pMVar10;
    iVar3 = local_100->wait_req_cnt;
    local_100->wait_req_cnt = iVar3 + 1;
    pMVar12 = local_100->wait_reqs + iVar3;
    pMVar12->cmd = 0x300;
    pMVar12->flag = 0x23;
    pMVar12->offset = 0;
    pMVar12->size = 0;
    pMVar12->data_ptr = 0;
    if ((mpp_server_debug & 1) != 0) {
      in_stack_fffffffffffffee0 =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                            *(undefined4 *)&local_108[4].next);
      _mpp_log_l(4,"mpp_server","batch %d:%d add task %d:%d:%d\n",(char *)0x0,
                 (ulong)local_100->batch_id,(ulong)*(uint *)&local_108[4].prev,
                 *(undefined4 *)&plVar7[4].prev,in_stack_fffffffffffffee0,
                 *(undefined4 *)((long)&local_108[4].next + 4));
    }
    if (local_100->fill_full != 0) {
      list_del_init(&local_100->link_server);
      list_add_tail(&local_100->link_server,(list_head *)((long)p + 0x38));
      if ((mpp_server_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_server","batch %d -> fill_nb %d fill ready\n",(char *)0x0,
                   (ulong)local_100->batch_id,(ulong)(uint)local_100->fill_cnt);
      }
      batch_send((MppDevBatServ *)p,local_100);
    }
  }
  abort();
}

Assistant:

void process_task(void *p)
{
    MppDevBatServ *server = (MppDevBatServ *)p;
    Mutex *lock = server->lock;
    RK_S32 ret = MPP_OK;
    MppDevTask *task;
    MppDevBatTask *batch;
    MppDevSession *session = NULL;
    MppDevBatCmd *bat_cmd;
    MppReqV1 *req = NULL;
    RK_S32 pending = 0;

    mpp_serv_dbg_flow("process task start\n");

    /* 1. try poll and get finished task */
    do {
        batch = list_first_entry_or_null(&server->list_batch, MppDevBatTask, link_server);
        if (NULL == batch)
            break;

        mpp_assert(batch->wait_req_cnt);
        ret = mpp_service_ioctl_request(server->server_fd, batch->wait_reqs);
        if (!ret) {
            MppDevTask *n;

            list_for_each_entry_safe(task, n, &batch->link_tasks, MppDevTask, link_batch) {
                RK_S32 batch_slot_id = task->batch_slot_id;
                MppDevBatCmd *cmd = batch->bat_cmd + batch_slot_id;

                mpp_assert(batch_slot_id < server->max_task_in_batch);
                session = task->session;

                ret = cmd->ret;
                if (ret == EAGAIN)
                    continue;

                if (ret == -EIO) {
                    mpp_err_f("batch %d:%d task %d poll error found\n",
                              batch->batch_id, task->batch_slot_id, task->task_id);
                    cmd->flag |= 1;
                    continue;
                }
                if (ret == 0) {
                    list_del_init(&task->link_batch);
                    task->batch = NULL;

                    mpp_serv_dbg_flow("batch %d:%d session %d ready and remove\n",
                                      batch->batch_id, task->batch_slot_id, session->client);
                    session->cond->lock();
                    session->task_done++;
                    session->cond->signal();
                    session->cond->unlock();
                    if (session->ctx && session->ctx->dev_cb)
                        mpp_callback(session->ctx->dev_cb, NULL);

                    batch->poll_cnt++;
                    cmd->flag |= 1;
                }
            }

            mpp_serv_dbg_flow("batch %d fill %d poll %d\n", batch->batch_id,
                              batch->fill_cnt, batch->poll_cnt);

            if (batch->poll_cnt == batch->fill_cnt) {
                mpp_serv_dbg_flow("batch %d poll done\n", batch->batch_id);
                list_del_init(&batch->link_server);
                list_add_tail(&batch->link_server, &server->list_batch_free);
                server->batch_run--;
                server->batch_free++;

                batch_reset(batch);
                batch = NULL;
                continue;
            }
        } else {
            mpp_log_f("batch %d poll ret %d errno %d %s", batch->batch_id,
                      ret, errno, strerror(errno));
            mpp_log_f("stop timer\n");
            mpp_timer_set_enable(server->timer, 0);
        }
        break;
    } while (1);

    /* 2. get prending task to fill */
    lock->lock();
    pending = server->pending_count;
    if (!pending && !server->batch_run && !server->session_count) {
        mpp_timer_set_enable(server->timer, 0);
        mpp_serv_dbg_flow("stop timer\n");
    }
    lock->unlock();

    mpp_serv_dbg_flow("pending %d running %d free %d max %d process start\n",
                      pending, server->batch_run, server->batch_free, server->batch_max_count);

try_proc_pending_task:
    /* 3. try get batch task*/
    if (!server->batch_free) {
        /* if not enough and max count does not reached create new batch */
        if (server->batch_free + server->batch_run >= server->batch_max_count) {
            mpp_serv_dbg_flow("finish for not batch slot\n");
            return ;
        }

        batch_add(server);
    }
    mpp_assert(server->batch_free);

    /* 4. if no pending task to send check timeout batch and send it */
    if (!pending) {
        if (!server->batch_free) {
            /* no pending and no free batch just done */
            return;
        }

        batch = list_first_entry_or_null(&server->list_batch_free, MppDevBatTask, link_server);
        mpp_assert(batch);
        if (NULL == batch) {
            mpp_log_f("batch run %d free %d\n", server->batch_run, server->batch_free);
            return;
        }

        /* send one timeout task */
        if (batch->fill_cnt)
            batch_send(server, batch);

        mpp_serv_dbg_flow("finish for no pending task\n");
        return;
    }

    mpp_serv_dbg_flow("pending task %d left to process\n", pending);

    /* 5. add task to add batch and try send batch */
    if (!server->batch_free) {
        /* no pending and no free batch just done */
        return;
    }

    batch = list_first_entry_or_null(&server->list_batch_free, MppDevBatTask, link_server);
    mpp_assert(batch);
    mpp_assert(pending);

    task = NULL;
    lock->lock();
    task = list_first_entry_or_null(&server->pending_task, MppDevTask, link_server);
    list_del_init(&task->link_server);
    server->pending_count--;
    lock->unlock();
    pending--;

    /* first task and setup new batch id */
    if (!batch->fill_cnt)
        batch->batch_id = server->batch_id++;

    task->batch = batch;
    task->batch_slot_id = batch->fill_cnt++;
    mpp_assert(task->batch_slot_id < server->max_task_in_batch);
    list_add_tail(&task->link_batch, &batch->link_tasks);
    if (batch->fill_cnt >= server->max_task_in_batch)
        batch->fill_full = 1;

    session = task->session;
    mpp_assert(session);
    mpp_assert(session->ctx);

    bat_cmd = batch->bat_cmd + task->batch_slot_id;
    bat_cmd->flag = 0;
    bat_cmd->client = session->client;
    bat_cmd->ret = 0;

    /* fill task to batch */
    /* add session info before each session task and then copy session request */
    req = &batch->send_reqs[batch->send_req_cnt++];
    req->cmd = MPP_CMD_SET_SESSION_FD;
    req->flag = MPP_FLAGS_MULTI_MSG;
    req->offset = 0;
    req->size = sizeof(*bat_cmd);
    req->data_ptr = REQ_DATA_PTR(bat_cmd);

    {
        RK_S32 i;

        for (i = 0; i < task->req_cnt; i++)
            batch->send_reqs[batch->send_req_cnt++] = task->req[i];
    }

    mpp_assert(batch->send_req_cnt <= server->max_task_in_batch * MAX_REQ_NUM);

    /* setup poll request */
    req = &batch->wait_reqs[batch->wait_req_cnt++];
    req->cmd = MPP_CMD_SET_SESSION_FD;
    req->flag = MPP_FLAGS_MULTI_MSG;
    req->offset = 0;
    req->size = sizeof(*bat_cmd);
    req->data_ptr = REQ_DATA_PTR(bat_cmd);

    req = &batch->wait_reqs[batch->wait_req_cnt++];
    req->cmd = MPP_CMD_POLL_HW_FINISH;
    req->flag = MPP_FLAGS_POLL_NON_BLOCK | MPP_FLAGS_MULTI_MSG | MPP_FLAGS_LAST_MSG;
    req->offset = 0;
    req->size = 0;
    req->data_ptr = 0;

    mpp_serv_dbg_flow("batch %d:%d add task %d:%d:%d\n",
                      batch->batch_id, task->batch_slot_id, session->client,
                      task->slot_idx, task->task_id);

    if (batch->fill_full) {
        list_del_init(&batch->link_server);
        list_add_tail(&batch->link_server, &server->list_batch);
        mpp_serv_dbg_flow("batch %d -> fill_nb %d fill ready\n",
                          batch->batch_id, batch->fill_cnt);
        batch_send(server, batch);
        batch = NULL;
    }
    goto try_proc_pending_task;
}